

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZRestoredInstance>::Resize(TPZVec<TPZRestoredInstance> *this,int64_t newsize)

{
  TPZRestoredInstance *pTVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  int64_t *piVar4;
  ulong uVar5;
  long lVar6;
  TPZRestoredInstance *pTVar7;
  long lVar8;
  bool bVar9;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar1 = this->fStore;
      if (pTVar1 != (TPZRestoredInstance *)0x0) {
        lVar6 = *(long *)&pTVar1[-1].is_already_read;
        if (lVar6 != 0) {
          lVar8 = lVar6 * 0x60;
          do {
            TPZRestoredInstance::~TPZRestoredInstance
                      ((TPZRestoredInstance *)
                       ((long)pTVar1[-1].mPointersVec.fExtAlloc + lVar8 + -0x30));
            lVar8 = lVar8 + -0x60;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar1[-1].is_already_read,lVar6 * 0x60 | 8);
      }
      this->fStore = (TPZRestoredInstance *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x60),8) == 0) {
        uVar5 = SUB168(auVar2 * ZEXT816(0x60),0) | 8;
      }
      piVar4 = (int64_t *)operator_new__(uVar5);
      *piVar4 = newsize;
      pTVar1 = (TPZRestoredInstance *)(piVar4 + 1);
      lVar6 = 0;
      pTVar7 = pTVar1;
      do {
        TPZRestoredInstance::TPZRestoredInstance(pTVar7);
        lVar6 = lVar6 + -0x60;
        pTVar7 = pTVar7 + 1;
      } while (newsize * -0x60 - lVar6 != 0);
      lVar6 = this->fNElements;
      if (newsize <= this->fNElements) {
        lVar6 = newsize;
      }
      lVar8 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar8;
      }
      while( true ) {
        pTVar7 = this->fStore;
        bVar9 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if (bVar9) break;
        TPZRestoredInstance::operator=
                  ((TPZRestoredInstance *)((long)(pTVar1->mPointersVec).fExtAlloc + lVar8 + -0x30),
                   (TPZRestoredInstance *)((long)(pTVar7->mPointersVec).fExtAlloc + lVar8 + -0x30));
        lVar8 = lVar8 + 0x60;
      }
      if (pTVar7 != (TPZRestoredInstance *)0x0) {
        lVar6 = *(long *)&pTVar7[-1].is_already_read;
        if (lVar6 != 0) {
          lVar8 = lVar6 * 0x60;
          do {
            TPZRestoredInstance::~TPZRestoredInstance
                      ((TPZRestoredInstance *)
                       ((long)pTVar7[-1].mPointersVec.fExtAlloc + lVar8 + -0x30));
            lVar8 = lVar8 + -0x60;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar7[-1].is_already_read,lVar6 * 0x60 | 8);
      }
      this->fStore = pTVar1;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}